

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Responses.cpp
# Opt level: O2

Response Response::ok(void)

{
  value_t vVar1;
  json_value jVar2;
  reference pvVar3;
  json_value extraout_RDX;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  *in_RDI;
  Response RVar4;
  allocator<char> local_41;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_40;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"ok",&local_41);
  Response((Response *)in_RDI,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json<const_char_(&)[3],_char[3],_0>(&local_40,(char (*) [3])"ok");
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>(in_RDI,"result");
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar3,"status");
  vVar1 = pvVar3->m_type;
  pvVar3->m_type = local_40.m_type;
  jVar2 = pvVar3->m_value;
  pvVar3->m_value = local_40.m_value;
  local_40.m_type = vVar1;
  local_40.m_value = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_40);
  RVar4.content.m_value.object = extraout_RDX.object;
  RVar4.content._0_8_ = in_RDI;
  return (Response)RVar4.content;
}

Assistant:

Response Response::ok() {
    Response r("ok");
    r.content["result"]["status"] = "ok";
    return r;
}